

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O1

void __thiscall glslang::TIntermediate::addRequestedExtension(TIntermediate *this,char *extension)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,extension,&local_31);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->requestedExtensions,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addRequestedExtension(const char* extension) { requestedExtensions.insert(extension); }